

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

xml_output * attrS(char *name,QString *v)

{
  bool bVar1;
  QString *in_RDX;
  xml_output *in_RDI;
  long in_FS_OFFSET;
  char *ch;
  
  ch = *(char **)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x276a7b);
  if (bVar1) {
    noxml();
  }
  else {
    QString::QString(in_RDX,ch);
    attr(in_RDX,(QString *)in_RDI);
    QString::~QString((QString *)0x276ab8);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == ch) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline XmlOutput::xml_output attrS(const char *name, const QString &v)
{
    if(v.isEmpty())
        return noxml();
    return attr(name, v);
}